

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_STOCHRSI_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                   int *outNBElement)

{
  TA_RetCode TVar1;
  int *outNBElement_local;
  int *outBegIdx_local;
  int endIdx_local;
  int startIdx_local;
  TA_ParamHolderPriv *params_local;
  
  TVar1 = TA_STOCHRSI(startIdx,endIdx,(params->in->data).inReal,(params->optIn->data).optInInteger,
                      params->optIn[1].data.optInInteger,params->optIn[2].data.optInInteger,
                      params->optIn[3].data.optInInteger,outBegIdx,outNBElement,
                      (params->out->data).outReal,params->out[1].data.outReal);
  return TVar1;
}

Assistant:

TA_RetCode TA_STOCHRSI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCHRSI(
/* Generated */                  startIdx,
/* Generated */                  endIdx,
/* Generated */                  params->in[0].data.inReal, /* inReal */
/* Generated */                  params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */                  params->optIn[1].data.optInInteger, /* optInFastK_Period*/
/* Generated */                  params->optIn[2].data.optInInteger, /* optInFastD_Period*/
/* Generated */                  (TA_MAType)params->optIn[3].data.optInInteger, /* optInFastD_MAType*/
/* Generated */                  outBegIdx, 
/* Generated */                  outNBElement, 
/* Generated */                  params->out[0].data.outReal, /*  outFastK */
/* Generated */                  params->out[1].data.outReal /*  outFastD */ );
/* Generated */ }